

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O3

SparseTextureProperties * __thiscall
Diligent::TextureBase<Diligent::EngineGLImplTraits>::GetSparseProperties
          (TextureBase<Diligent::EngineGLImplTraits> *this)

{
  SparseTextureProperties *pSVar1;
  char (*in_RCX) [26];
  string msg;
  string local_30;
  
  if ((this->
      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
      ).m_Desc.Usage != USAGE_SPARSE) {
    FormatString<char[64]>
              (&local_30,
               (char (*) [64])"ITexture::GetSparseProperties() must be used for sparse texture");
    in_RCX = (char (*) [26])0x152;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x152);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  pSVar1 = (this->m_pSparseProps)._M_t.
           super___uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
           ._M_t.
           super__Tuple_impl<0UL,_Diligent::SparseTextureProperties_*,_std::default_delete<Diligent::SparseTextureProperties>_>
           .super__Head_base<0UL,_Diligent::SparseTextureProperties_*,_false>._M_head_impl;
  if (pSVar1 == (SparseTextureProperties *)0x0) {
    FormatString<char[26],char[26]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pSparseProps != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x153);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = (this->m_pSparseProps)._M_t.
             super___uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
             ._M_t.
             super__Tuple_impl<0UL,_Diligent::SparseTextureProperties_*,_std::default_delete<Diligent::SparseTextureProperties>_>
             .super__Head_base<0UL,_Diligent::SparseTextureProperties_*,_false>._M_head_impl;
  }
  return pSVar1;
}

Assistant:

GetSparseProperties() const override final
    {
        DEV_CHECK_ERR(this->m_Desc.Usage == USAGE_SPARSE,
                      "ITexture::GetSparseProperties() must be used for sparse texture");
        VERIFY_EXPR(m_pSparseProps != nullptr);
        return *m_pSparseProps;
    }